

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void WindowSettingsHandler_ReadLine
               (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,void *entry,char *line)

{
  int iVar1;
  undefined8 in_RCX;
  long in_RDX;
  ImU32 u1;
  int i;
  int y;
  int x;
  ImGuiWindowSettings *settings;
  ImVec2ih local_44;
  ImVec2ih local_40;
  ImVec2ih local_3c;
  undefined4 local_38;
  int local_34;
  short local_30 [2];
  short local_2c [2];
  long local_28;
  undefined8 local_20;
  
  local_28 = in_RDX;
  local_20 = in_RCX;
  iVar1 = __isoc99_sscanf(in_RCX,"Pos=%i,%i",local_2c,local_30);
  if (iVar1 == 2) {
    ImVec2ih::ImVec2ih(&local_3c,local_2c[0],local_30[0]);
    *(ImVec2ih *)(local_28 + 4) = local_3c;
  }
  else {
    iVar1 = __isoc99_sscanf(local_20,"Size=%i,%i",local_2c,local_30);
    if (iVar1 == 2) {
      ImVec2ih::ImVec2ih(&local_40,local_2c[0],local_30[0]);
      *(ImVec2ih *)(local_28 + 8) = local_40;
    }
    else {
      iVar1 = __isoc99_sscanf(local_20,"ViewportId=0x%08X",&local_38);
      if (iVar1 == 1) {
        *(undefined4 *)(local_28 + 0x10) = local_38;
      }
      else {
        iVar1 = __isoc99_sscanf(local_20,"ViewportPos=%i,%i",local_2c,local_30);
        if (iVar1 == 2) {
          ImVec2ih::ImVec2ih(&local_44,local_2c[0],local_30[0]);
          *(ImVec2ih *)(local_28 + 0xc) = local_44;
        }
        else {
          iVar1 = __isoc99_sscanf(local_20,"Collapsed=%d",&local_34);
          if (iVar1 == 1) {
            *(bool *)(local_28 + 0x1e) = local_34 != 0;
          }
          else {
            iVar1 = __isoc99_sscanf(local_20,"DockId=0x%X,%d",&local_38,&local_34);
            if (iVar1 == 2) {
              *(undefined4 *)(local_28 + 0x14) = local_38;
              *(short *)(local_28 + 0x1c) = (short)local_34;
            }
            else {
              iVar1 = __isoc99_sscanf(local_20,"DockId=0x%X",&local_38);
              if (iVar1 == 1) {
                *(undefined4 *)(local_28 + 0x14) = local_38;
                *(undefined2 *)(local_28 + 0x1c) = 0xffff;
              }
              else {
                iVar1 = __isoc99_sscanf(local_20,"ClassId=0x%X",&local_38);
                if (iVar1 == 1) {
                  *(undefined4 *)(local_28 + 0x18) = local_38;
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void WindowSettingsHandler_ReadLine(ImGuiContext*, ImGuiSettingsHandler*, void* entry, const char* line)
{
    ImGuiWindowSettings* settings = (ImGuiWindowSettings*)entry;
    int x, y;
    int i;
    ImU32 u1;
    if (sscanf(line, "Pos=%i,%i", &x, &y) == 2)                 { settings->Pos = ImVec2ih((short)x, (short)y); }
    else if (sscanf(line, "Size=%i,%i", &x, &y) == 2)           { settings->Size = ImVec2ih((short)x, (short)y); }
    else if (sscanf(line, "ViewportId=0x%08X", &u1) == 1)       { settings->ViewportId = u1; }
    else if (sscanf(line, "ViewportPos=%i,%i", &x, &y) == 2)    { settings->ViewportPos = ImVec2ih((short)x, (short)y); }
    else if (sscanf(line, "Collapsed=%d", &i) == 1)             { settings->Collapsed = (i != 0); }
    else if (sscanf(line, "DockId=0x%X,%d", &u1, &i) == 2)      { settings->DockId = u1; settings->DockOrder = (short)i; }
    else if (sscanf(line, "DockId=0x%X", &u1) == 1)             { settings->DockId = u1; settings->DockOrder = -1; }
    else if (sscanf(line, "ClassId=0x%X", &u1) == 1)            { settings->ClassId = u1; }
}